

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::BackgroundCall(DBImpl *this)

{
  std::mutex::lock(&(this->mutex_).mu_);
  if (this->background_compaction_scheduled_ != false) {
    if ((((this->shutting_down_)._M_base._M_i & 1U) == 0) &&
       ((this->bg_error_).state_ == (char *)0x0)) {
      BackgroundCompaction(this);
    }
    this->background_compaction_scheduled_ = false;
    MaybeScheduleCompaction(this);
    std::condition_variable::notify_all();
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
  __assert_fail("background_compaction_scheduled_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                ,0x2a8,"void leveldb::DBImpl::BackgroundCall()");
}

Assistant:

void DBImpl::BackgroundCall() {
  MutexLock l(&mutex_);
  assert(background_compaction_scheduled_);
  if (shutting_down_.load(std::memory_order_acquire)) {
    // No more background work when shutting down.
  } else if (!bg_error_.ok()) {
    // No more background work after a background error.
  } else {
    BackgroundCompaction();
  }

  background_compaction_scheduled_ = false;

  // Previous compaction may have produced too many files in a level,
  // so reschedule another compaction if needed.
  MaybeScheduleCompaction();
  background_work_finished_signal_.SignalAll();
}